

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void __thiscall cmExtraEclipseCDT4Generator::CreateProjectFile(cmExtraEclipseCDT4Generator *this)

{
  string *__lhs;
  pointer pbVar1;
  bool bVar2;
  string *psVar3;
  _Base_ptr p_Var4;
  cmState *this_00;
  char *pcVar5;
  string *n;
  pointer value;
  string sourceLinkedResourceName;
  allocator<char> local_65a;
  allocator<char> local_659;
  cmLocalGenerator *local_658;
  cmMakefile *local_650;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraNatures;
  cmXMLWriter xml;
  string local_5c8;
  string compilerId;
  ostringstream environment;
  string filename;
  ostringstream errorOutputParser;
  cmGeneratedFileStream fout;
  
  local_658 = *(((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->LocalGenerators)
               .super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
               super__Vector_impl_data._M_start;
  local_650 = local_658->Makefile;
  __lhs = &this->HomeOutputDirectory;
  std::operator+(&filename,__lhs,"/.project");
  cmGeneratedFileStream::cmGeneratedFileStream(&fout,&filename,false,None);
  if (((&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) != 0) goto LAB_0027eea8;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&environment,"CMAKE_C_COMPILER_ID",(allocator<char> *)&errorOutputParser);
  psVar3 = cmMakefile::GetSafeDefinition(local_650,(string *)&environment);
  std::__cxx11::string::string((string *)&compilerId,(string *)psVar3);
  std::__cxx11::string::~string((string *)&environment);
  if (compilerId._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&environment,"CMAKE_CXX_COMPILER_ID",(allocator<char> *)&errorOutputParser)
    ;
    cmMakefile::GetSafeDefinition(local_650,(string *)&environment);
    std::__cxx11::string::_M_assign((string *)&compilerId);
    std::__cxx11::string::~string((string *)&environment);
  }
  cmXMLWriter::cmXMLWriter(&xml,(ostream *)&fout,0);
  cmXMLWriter::StartDocument(&xml,"UTF-8");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&environment,"projectDescription",(allocator<char> *)&errorOutputParser);
  cmXMLWriter::StartElement(&xml,(string *)&environment);
  std::__cxx11::string::~string((string *)&environment);
  std::__cxx11::string::string<std::allocator<char>>((string *)&environment,"name",&local_659);
  cmLocalGenerator::GetProjectName_abi_cxx11_(&sourceLinkedResourceName,local_658);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&extraNatures,"CMAKE_BUILD_TYPE",&local_65a);
  psVar3 = cmMakefile::GetSafeDefinition(local_650,(string *)&extraNatures);
  GetPathBasename(&local_5c8,__lhs);
  GenerateProjectName((string *)&errorOutputParser,&sourceLinkedResourceName,psVar3,&local_5c8);
  cmXMLWriter::Element<std::__cxx11::string>
            (&xml,(string *)&environment,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&errorOutputParser
            );
  std::__cxx11::string::~string((string *)&errorOutputParser);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string((string *)&extraNatures);
  std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
  std::__cxx11::string::~string((string *)&environment);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&environment,"comment",(allocator<char> *)&errorOutputParser);
  cmXMLWriter::Element<char[1]>(&xml,(string *)&environment,(char (*) [1])0x4116ee);
  std::__cxx11::string::~string((string *)&environment);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&environment,"projects",(allocator<char> *)&errorOutputParser);
  cmXMLWriter::Element<char[1]>(&xml,(string *)&environment,(char (*) [1])0x4116ee);
  std::__cxx11::string::~string((string *)&environment);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&environment,"buildSpec",(allocator<char> *)&errorOutputParser);
  cmXMLWriter::StartElement(&xml,(string *)&environment);
  std::__cxx11::string::~string((string *)&environment);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&environment,"buildCommand",(allocator<char> *)&errorOutputParser);
  cmXMLWriter::StartElement(&xml,(string *)&environment);
  std::__cxx11::string::~string((string *)&environment);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&environment,"name",(allocator<char> *)&errorOutputParser);
  cmXMLWriter::Element<char[38]>
            (&xml,(string *)&environment,(char (*) [38])"org.eclipse.cdt.make.core.makeBuilder");
  std::__cxx11::string::~string((string *)&environment);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&environment,"triggers",(allocator<char> *)&errorOutputParser);
  cmXMLWriter::Element<char[24]>
            (&xml,(string *)&environment,(char (*) [24])"clean,full,incremental,");
  std::__cxx11::string::~string((string *)&environment);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&environment,"arguments",(allocator<char> *)&errorOutputParser);
  cmXMLWriter::StartElement(&xml,(string *)&environment);
  std::__cxx11::string::~string((string *)&environment);
  AppendDictionary<char[6]>
            (&xml,"org.eclipse.cdt.make.core.cleanBuildTarget",(char (*) [6])0x4026de);
  AppendDictionary<char[5]>
            (&xml,"org.eclipse.cdt.make.core.enableCleanBuild",(char (*) [5])0x429fde);
  AppendDictionary<char[5]>
            (&xml,"org.eclipse.cdt.make.core.append_environment",(char (*) [5])0x429fde);
  AppendDictionary<char[5]>(&xml,"org.eclipse.cdt.make.core.stopOnError",(char (*) [5])0x429fde);
  AppendDictionary<char[5]>
            (&xml,"org.eclipse.cdt.make.core.enabledIncrementalBuild",(char (*) [5])0x429fde);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&errorOutputParser,"CMAKE_MAKE_PROGRAM",
             (allocator<char> *)&sourceLinkedResourceName);
  psVar3 = cmMakefile::GetRequiredDefinition(local_650,(string *)&errorOutputParser);
  std::__cxx11::string::string((string *)&environment,(string *)psVar3);
  AppendDictionary<std::__cxx11::string>
            (&xml,"org.eclipse.cdt.make.core.build.command",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&environment);
  std::__cxx11::string::~string((string *)&environment);
  std::__cxx11::string::~string((string *)&errorOutputParser);
  AppendDictionary<char[47]>
            (&xml,"org.eclipse.cdt.make.core.contents",
             (char (*) [47])"org.eclipse.cdt.make.core.activeConfigSettings");
  AppendDictionary<char[4]>
            (&xml,"org.eclipse.cdt.make.core.build.target.inc",(char (*) [4])0x3f6308);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&environment,"CMAKE_ECLIPSE_MAKE_ARGUMENTS",
             (allocator<char> *)&errorOutputParser);
  psVar3 = cmMakefile::GetSafeDefinition(local_650,(string *)&environment);
  AppendDictionary<std::__cxx11::string>(&xml,"org.eclipse.cdt.make.core.build.arguments",psVar3);
  std::__cxx11::string::~string((string *)&environment);
  std::__cxx11::string::string((string *)&environment,(string *)__lhs);
  AppendDictionary<std::__cxx11::string>
            (&xml,"org.eclipse.cdt.make.core.buildLocation",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&environment);
  std::__cxx11::string::~string((string *)&environment);
  AppendDictionary<char[6]>
            (&xml,"org.eclipse.cdt.make.core.useDefaultBuildCmd",(char (*) [6])0x401088);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&environment);
  std::operator<<((ostream *)&environment,"VERBOSE=1|CMAKE_NO_VERBOSE=1|");
  bVar2 = std::operator==(&compilerId,"MSVC");
  if (bVar2) {
    AddEnvVar((ostream *)&environment,"PATH",local_658);
    AddEnvVar((ostream *)&environment,"INCLUDE",local_658);
    AddEnvVar((ostream *)&environment,"LIB",local_658);
    pcVar5 = "LIBPATH";
LAB_0027e8fc:
    AddEnvVar((ostream *)&environment,pcVar5,local_658);
  }
  else {
    bVar2 = std::operator==(&compilerId,"Intel");
    if (bVar2) {
      pcVar5 = "INTEL_LICENSE_FILE";
      goto LAB_0027e8fc;
    }
  }
  std::__cxx11::stringbuf::str();
  AppendDictionary<std::__cxx11::string>
            (&xml,"org.eclipse.cdt.make.core.environment",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&errorOutputParser
            );
  std::__cxx11::string::~string((string *)&errorOutputParser);
  AppendDictionary<char[5]>(&xml,"org.eclipse.cdt.make.core.enableFullBuild",(char (*) [5])0x429fde)
  ;
  AppendDictionary<char[4]>
            (&xml,"org.eclipse.cdt.make.core.build.target.auto",(char (*) [4])0x3f6308);
  AppendDictionary<char[6]>(&xml,"org.eclipse.cdt.make.core.enableAutoBuild",(char (*) [6])0x401088)
  ;
  AppendDictionary<char[6]>
            (&xml,"org.eclipse.cdt.make.core.build.target.clean",(char (*) [6])0x4026de);
  AppendDictionary<char[4]>(&xml,"org.eclipse.cdt.make.core.fullBuildTarget",(char (*) [4])0x3f6308)
  ;
  AppendDictionary<char[1]>(&xml,"org.eclipse.cdt.make.core.buildArguments",(char (*) [1])0x4116ee);
  std::__cxx11::string::string((string *)&errorOutputParser,(string *)__lhs);
  AppendDictionary<std::__cxx11::string>
            (&xml,"org.eclipse.cdt.make.core.build.location",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&errorOutputParser
            );
  std::__cxx11::string::~string((string *)&errorOutputParser);
  AppendDictionary<char[4]>(&xml,"org.eclipse.cdt.make.core.autoBuildTarget",(char (*) [4])0x3f6308)
  ;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&errorOutputParser);
  bVar2 = std::operator==(&compilerId,"MSVC");
  if (bVar2) {
    pcVar5 = "org.eclipse.cdt.core.VCErrorParser;";
LAB_0027ea76:
    std::operator<<((ostream *)&errorOutputParser,pcVar5);
  }
  else {
    bVar2 = std::operator==(&compilerId,"Intel");
    if (bVar2) {
      pcVar5 = "org.eclipse.cdt.core.ICCErrorParser;";
      goto LAB_0027ea76;
    }
  }
  pcVar5 = "org.eclipse.cdt.core.MakeErrorParser;";
  if (this->SupportsGmakeErrorParser != false) {
    pcVar5 = "org.eclipse.cdt.core.GmakeErrorParser;";
  }
  std::operator<<((ostream *)&errorOutputParser,pcVar5);
  std::operator<<((ostream *)&errorOutputParser,
                  "org.eclipse.cdt.core.GCCErrorParser;org.eclipse.cdt.core.GASErrorParser;org.eclipse.cdt.core.GLDErrorParser;"
                 );
  std::__cxx11::stringbuf::str();
  AppendDictionary<std::__cxx11::string>
            (&xml,"org.eclipse.cdt.core.errorOutputParser",&sourceLinkedResourceName);
  std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
  cmXMLWriter::EndElement(&xml);
  cmXMLWriter::EndElement(&xml);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sourceLinkedResourceName,"buildCommand",(allocator<char> *)&extraNatures);
  cmXMLWriter::StartElement(&xml,&sourceLinkedResourceName);
  std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sourceLinkedResourceName,"name",(allocator<char> *)&extraNatures);
  cmXMLWriter::Element<char[47]>
            (&xml,&sourceLinkedResourceName,
             (char (*) [47])"org.eclipse.cdt.make.core.ScannerConfigBuilder");
  std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sourceLinkedResourceName,"arguments",(allocator<char> *)&extraNatures);
  cmXMLWriter::StartElement(&xml,&sourceLinkedResourceName);
  std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
  cmXMLWriter::EndElement(&xml);
  cmXMLWriter::EndElement(&xml);
  cmXMLWriter::EndElement(&xml);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sourceLinkedResourceName,"natures",(allocator<char> *)&extraNatures);
  cmXMLWriter::StartElement(&xml,&sourceLinkedResourceName);
  std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sourceLinkedResourceName,"nature",(allocator<char> *)&extraNatures);
  cmXMLWriter::Element<char[37]>
            (&xml,&sourceLinkedResourceName,(char (*) [37])"org.eclipse.cdt.make.core.makeNature");
  std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sourceLinkedResourceName,"nature",(allocator<char> *)&extraNatures);
  cmXMLWriter::Element<char[46]>
            (&xml,&sourceLinkedResourceName,
             (char (*) [46])"org.eclipse.cdt.make.core.ScannerConfigNature");
  std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
  for (p_Var4 = (this->Natures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->Natures)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sourceLinkedResourceName,"nature",(allocator<char> *)&extraNatures);
    cmXMLWriter::Element<std::__cxx11::string>
              (&xml,&sourceLinkedResourceName,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var4 + 1));
    std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
  }
  this_00 = cmMakefile::GetState(local_650);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sourceLinkedResourceName,"ECLIPSE_EXTRA_NATURES",
             (allocator<char> *)&extraNatures);
  pcVar5 = cmState::GetGlobalProperty(this_00,&sourceLinkedResourceName);
  std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
  if (pcVar5 != (char *)0x0) {
    extraNatures.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    extraNatures.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    extraNatures.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sourceLinkedResourceName,pcVar5,(allocator<char> *)&local_5c8);
    cmSystemTools::ExpandListArgument(&sourceLinkedResourceName,&extraNatures,false);
    std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
    pbVar1 = extraNatures.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (value = extraNatures.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; value != pbVar1; value = value + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sourceLinkedResourceName,"nature",(allocator<char> *)&local_5c8);
      cmXMLWriter::Element<std::__cxx11::string>(&xml,&sourceLinkedResourceName,value);
      std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&extraNatures);
  }
  cmXMLWriter::EndElement(&xml);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sourceLinkedResourceName,"linkedResources",(allocator<char> *)&extraNatures)
  ;
  cmXMLWriter::StartElement(&xml,&sourceLinkedResourceName);
  std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
  if (this->IsOutOfSourceBuild == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sourceLinkedResourceName,"[Source directory]",
               (allocator<char> *)&extraNatures);
    psVar3 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_(local_658);
    std::__cxx11::string::string((string *)&extraNatures,(string *)psVar3);
    bVar2 = cmsys::SystemTools::IsSubDirectory(__lhs,(string *)&extraNatures);
    if (!bVar2) {
      std::__cxx11::string::string((string *)&local_5c8,(string *)&extraNatures);
      AppendLinkedResource(&xml,&sourceLinkedResourceName,&local_5c8,LinkToFolder);
      std::__cxx11::string::~string((string *)&local_5c8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->SrcLinkedResources,&sourceLinkedResourceName);
    }
    std::__cxx11::string::~string((string *)&extraNatures);
    std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
  }
  if (this->SupportsVirtualFolders == true) {
    CreateLinksToSubprojects(this,&xml,__lhs);
    CreateLinksForTargets(this,&xml);
  }
  cmXMLWriter::EndElement(&xml);
  cmXMLWriter::EndElement(&xml);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&errorOutputParser);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&environment);
  cmXMLWriter::~cmXMLWriter(&xml);
  std::__cxx11::string::~string((string *)&compilerId);
LAB_0027eea8:
  cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateProjectFile()
{
  cmLocalGenerator* lg = this->GlobalGenerator->GetLocalGenerators()[0];
  cmMakefile* mf = lg->GetMakefile();

  const std::string filename = this->HomeOutputDirectory + "/.project";

  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  std::string compilerId = mf->GetSafeDefinition("CMAKE_C_COMPILER_ID");
  if (compilerId.empty()) // no C compiler, try the C++ compiler:
  {
    compilerId = mf->GetSafeDefinition("CMAKE_CXX_COMPILER_ID");
  }

  cmXMLWriter xml(fout);

  xml.StartDocument("UTF-8");
  xml.StartElement("projectDescription");

  xml.Element("name",
              cmExtraEclipseCDT4Generator::GenerateProjectName(
                lg->GetProjectName(),
                mf->GetSafeDefinition("CMAKE_BUILD_TYPE"),
                cmExtraEclipseCDT4Generator::GetPathBasename(
                  this->HomeOutputDirectory)));

  xml.Element("comment", "");
  xml.Element("projects", "");

  xml.StartElement("buildSpec");
  xml.StartElement("buildCommand");
  xml.Element("name", "org.eclipse.cdt.make.core.makeBuilder");
  xml.Element("triggers", "clean,full,incremental,");
  xml.StartElement("arguments");

  // use clean target
  AppendDictionary(xml, "org.eclipse.cdt.make.core.cleanBuildTarget", "clean");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.enableCleanBuild", "true");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.append_environment",
                   "true");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.stopOnError", "true");

  // set the make command
  AppendDictionary(xml, "org.eclipse.cdt.make.core.enabledIncrementalBuild",
                   "true");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.command",
                   cmExtraEclipseCDT4Generator::GetEclipsePath(
                     mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM")));
  AppendDictionary(xml, "org.eclipse.cdt.make.core.contents",
                   "org.eclipse.cdt.make.core.activeConfigSettings");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.target.inc", "all");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.arguments",
                   mf->GetSafeDefinition("CMAKE_ECLIPSE_MAKE_ARGUMENTS"));
  AppendDictionary(
    xml, "org.eclipse.cdt.make.core.buildLocation",
    cmExtraEclipseCDT4Generator::GetEclipsePath(this->HomeOutputDirectory));
  AppendDictionary(xml, "org.eclipse.cdt.make.core.useDefaultBuildCmd",
                   "false");

  // set project specific environment
  std::ostringstream environment;
  environment << "VERBOSE=1|CMAKE_NO_VERBOSE=1|"; // verbose Makefile output
  // set vsvars32.bat environment available at CMake time,
  //   but not necessarily when eclipse is open
  if (compilerId == "MSVC") {
    AddEnvVar(environment, "PATH", lg);
    AddEnvVar(environment, "INCLUDE", lg);
    AddEnvVar(environment, "LIB", lg);
    AddEnvVar(environment, "LIBPATH", lg);
  } else if (compilerId == "Intel") {
    // if the env.var is set, use this one and put it in the cache
    // if the env.var is not set, but the value is in the cache,
    // use it from the cache:
    AddEnvVar(environment, "INTEL_LICENSE_FILE", lg);
  }
  AppendDictionary(xml, "org.eclipse.cdt.make.core.environment",
                   environment.str());

  AppendDictionary(xml, "org.eclipse.cdt.make.core.enableFullBuild", "true");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.target.auto", "all");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.enableAutoBuild", "false");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.target.clean",
                   "clean");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.fullBuildTarget", "all");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.buildArguments", "");
  AppendDictionary(
    xml, "org.eclipse.cdt.make.core.build.location",
    cmExtraEclipseCDT4Generator::GetEclipsePath(this->HomeOutputDirectory));
  AppendDictionary(xml, "org.eclipse.cdt.make.core.autoBuildTarget", "all");

  // set error parsers
  std::ostringstream errorOutputParser;

  if (compilerId == "MSVC") {
    errorOutputParser << "org.eclipse.cdt.core.VCErrorParser;";
  } else if (compilerId == "Intel") {
    errorOutputParser << "org.eclipse.cdt.core.ICCErrorParser;";
  }

  if (this->SupportsGmakeErrorParser) {
    errorOutputParser << "org.eclipse.cdt.core.GmakeErrorParser;";
  } else {
    errorOutputParser << "org.eclipse.cdt.core.MakeErrorParser;";
  }

  errorOutputParser << "org.eclipse.cdt.core.GCCErrorParser;"
                       "org.eclipse.cdt.core.GASErrorParser;"
                       "org.eclipse.cdt.core.GLDErrorParser;";
  AppendDictionary(xml, "org.eclipse.cdt.core.errorOutputParser",
                   errorOutputParser.str());

  xml.EndElement(); // arguments
  xml.EndElement(); // buildCommand
  xml.StartElement("buildCommand");
  xml.Element("name", "org.eclipse.cdt.make.core.ScannerConfigBuilder");
  xml.StartElement("arguments");
  xml.EndElement(); // arguments
  xml.EndElement(); // buildCommand
  xml.EndElement(); // buildSpec

  // set natures for c/c++ projects
  xml.StartElement("natures");
  xml.Element("nature", "org.eclipse.cdt.make.core.makeNature");
  xml.Element("nature", "org.eclipse.cdt.make.core.ScannerConfigNature");

  for (std::string const& n : this->Natures) {
    xml.Element("nature", n);
  }

  if (const char* extraNaturesProp =
        mf->GetState()->GetGlobalProperty("ECLIPSE_EXTRA_NATURES")) {
    std::vector<std::string> extraNatures;
    cmSystemTools::ExpandListArgument(extraNaturesProp, extraNatures);
    for (std::string const& n : extraNatures) {
      xml.Element("nature", n);
    }
  }

  xml.EndElement(); // natures

  xml.StartElement("linkedResources");
  // create linked resources
  if (this->IsOutOfSourceBuild) {
    // create a linked resource to CMAKE_SOURCE_DIR
    // (this is not done anymore for each project because of
    // https://gitlab.kitware.com/cmake/cmake/issues/9978 and because I found
    // it actually quite confusing in bigger projects with many directories and
    // projects, Alex

    std::string sourceLinkedResourceName = "[Source directory]";
    std::string linkSourceDirectory =
      cmExtraEclipseCDT4Generator::GetEclipsePath(
        lg->GetCurrentSourceDirectory());
    // .project dir can't be subdir of a linked resource dir
    if (!cmSystemTools::IsSubDirectory(this->HomeOutputDirectory,
                                       linkSourceDirectory)) {
      cmExtraEclipseCDT4Generator::AppendLinkedResource(
        xml, sourceLinkedResourceName,
        cmExtraEclipseCDT4Generator::GetEclipsePath(linkSourceDirectory),
        LinkToFolder);
      this->SrcLinkedResources.push_back(std::move(sourceLinkedResourceName));
    }
  }

  if (this->SupportsVirtualFolders) {
    this->CreateLinksToSubprojects(xml, this->HomeOutputDirectory);

    this->CreateLinksForTargets(xml);
  }

  xml.EndElement(); // linkedResources
  xml.EndElement(); // projectDescription
}